

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

ArrayInfo * GGUFMeta::GKV_Base<GGUFMeta::ArrayInfo>::getter(gguf_context *ctx,int k)

{
  gguf_type gVar1;
  size_t sVar2;
  int in_EDX;
  undefined8 in_RSI;
  ArrayInfo *in_RDI;
  gguf_type arr_type;
  void *local_30;
  
  gVar1 = gguf_get_arr_type(in_RSI,(long)in_EDX);
  in_RDI->gt = gVar1;
  sVar2 = gguf_get_arr_n(in_RSI,(long)in_EDX);
  in_RDI->length = sVar2;
  if (gVar1 == GGUF_TYPE_STRING) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = (void *)gguf_get_arr_data(in_RSI,(long)in_EDX);
  }
  in_RDI->data = local_30;
  return in_RDI;
}

Assistant:

static ArrayInfo getter(const gguf_context *ctx, const int k) {
            const enum gguf_type arr_type = gguf_get_arr_type(ctx, k);
            return ArrayInfo {
                arr_type,
                size_t(gguf_get_arr_n(ctx, k)),
                arr_type == GGUF_TYPE_STRING ? nullptr : gguf_get_arr_data(ctx, k),
            };
        }